

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::detachClause(Solver *this,CRef cr,bool strict)

{
  uint64_t *puVar1;
  long *plVar2;
  uint *puVar3;
  undefined8 in_RAX;
  undefined3 in_register_00000011;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *this_00;
  Watcher local_38;
  
  puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
  this_00 = &this->watches;
  if ((uint)((ulong)*(undefined8 *)(puVar3 + cr) >> 0x22) == 2) {
    this_00 = &this->watches_bin;
  }
  puVar1 = &(this->statistics).solveSteps;
  *puVar1 = *puVar1 + 1;
  if (CONCAT31(in_register_00000011,strict) == 0) {
    local_38.blocker.x = (int)((ulong)in_RAX >> 0x20);
    local_38 = (Watcher)(CONCAT44(local_38.blocker.x,puVar3[(ulong)cr + 2]) ^ 1);
    OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::smudge
              (this_00,(Lit *)&local_38);
    local_38 = (Watcher)(CONCAT44(local_38.blocker.x,puVar3[(ulong)cr + 3]) ^ 1);
    OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::smudge
              (this_00,(Lit *)&local_38);
  }
  else {
    local_38.blocker.x = puVar3[(ulong)cr + 3];
    local_38.cref = cr;
    remove<Minisat::vec<Minisat::Watcher>,Minisat::Watcher>
              ((this_00->occs).data + ((long)(int)puVar3[(ulong)cr + 2] ^ 1),&local_38);
    local_38.blocker.x = puVar3[(ulong)cr + 2];
    remove<Minisat::vec<Minisat::Watcher>,Minisat::Watcher>
              ((this_00->occs).data + ((long)(int)puVar3[(ulong)cr + 3] ^ 1),&local_38);
  }
  plVar2 = (long *)((long)&this->clauses_literals + (ulong)((uint)*(ulong *)(puVar3 + cr) & 4) * 2);
  *plVar2 = *plVar2 - (*(ulong *)(puVar3 + cr) >> 0x22);
  return;
}

Assistant:

void Solver::detachClause(CRef cr, bool strict)
{
    const Clause &c = ca[cr];
    assert(c.size() > 1);

    OccLists<Lit, vec<Watcher>, WatcherDeleted> &ws = c.size() == 2 ? watches_bin : watches;
    statistics.solveSteps++;

    // Strict or lazy detaching:
    if (strict) {
        remove(ws[~c[0]], Watcher(cr, c[1]));
        remove(ws[~c[1]], Watcher(cr, c[0]));
    } else {
        // Lazy detaching: (NOTE! Must clean all watcher lists before garbage collecting this clause)
        ws.smudge(~c[0]);
        ws.smudge(~c[1]);
    }

    if (c.learnt())
        learnts_literals -= c.size();
    else
        clauses_literals -= c.size();
}